

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegFreeRegexp(xmlRegexpPtr regexp)

{
  long lVar1;
  
  if (regexp != (xmlRegexpPtr)0x0) {
    if (regexp->string != (xmlChar *)0x0) {
      (*xmlFree)(regexp->string);
    }
    if (regexp->states != (xmlRegStatePtr *)0x0) {
      if (0 < regexp->nbStates) {
        lVar1 = 0;
        do {
          xmlRegFreeState(regexp->states[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < regexp->nbStates);
      }
      (*xmlFree)(regexp->states);
    }
    if (regexp->atoms != (xmlRegAtomPtr *)0x0) {
      if (0 < regexp->nbAtoms) {
        lVar1 = 0;
        do {
          xmlRegFreeAtom(regexp->atoms[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < regexp->nbAtoms);
      }
      (*xmlFree)(regexp->atoms);
    }
    if (regexp->counters != (xmlRegCounter *)0x0) {
      (*xmlFree)(regexp->counters);
    }
    if (regexp->compact != (int *)0x0) {
      (*xmlFree)(regexp->compact);
    }
    if (regexp->transdata != (void **)0x0) {
      (*xmlFree)(regexp->transdata);
    }
    if (regexp->stringMap != (xmlChar **)0x0) {
      if (0 < regexp->nbstrings) {
        lVar1 = 0;
        do {
          (*xmlFree)(regexp->stringMap[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < regexp->nbstrings);
      }
      (*xmlFree)(regexp->stringMap);
    }
    (*xmlFree)(regexp);
    return;
  }
  return;
}

Assistant:

void
xmlRegFreeRegexp(xmlRegexpPtr regexp) {
    int i;
    if (regexp == NULL)
	return;

    if (regexp->string != NULL)
	xmlFree(regexp->string);
    if (regexp->states != NULL) {
	for (i = 0;i < regexp->nbStates;i++)
	    xmlRegFreeState(regexp->states[i]);
	xmlFree(regexp->states);
    }
    if (regexp->atoms != NULL) {
	for (i = 0;i < regexp->nbAtoms;i++)
	    xmlRegFreeAtom(regexp->atoms[i]);
	xmlFree(regexp->atoms);
    }
    if (regexp->counters != NULL)
	xmlFree(regexp->counters);
    if (regexp->compact != NULL)
	xmlFree(regexp->compact);
    if (regexp->transdata != NULL)
	xmlFree(regexp->transdata);
    if (regexp->stringMap != NULL) {
	for (i = 0; i < regexp->nbstrings;i++)
	    xmlFree(regexp->stringMap[i]);
	xmlFree(regexp->stringMap);
    }

    xmlFree(regexp);
}